

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::RecordReadSample(DBImpl *this,Slice key)

{
  bool bVar1;
  
  std::mutex::lock(&(this->mutex_).mu_);
  bVar1 = Version::RecordReadSample(this->versions_->current_,key);
  if (bVar1) {
    MaybeScheduleCompaction(this);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void DBImpl::RecordReadSample(Slice key) {
  MutexLock l(&mutex_);
  if (versions_->current()->RecordReadSample(key)) {
    MaybeScheduleCompaction();
  }
}